

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

Vector<double,_2> __thiscall mathtool::Vector<double,_2>::normalize(Vector<double,_2> *this)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ostream *poVar4;
  double *in_RSI;
  long lVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Vector<double,_2> VVar10;
  
  this->v[0] = 0.0;
  this->v[1] = 0.0;
  dVar9 = SQRT(in_RSI[1] * in_RSI[1] + *in_RSI * *in_RSI + 0.0);
  dVar2 = dVar9 * 10000000000.0;
  lVar5 = 0;
  dVar7 = -0.0;
  bVar6 = true;
  while( true ) {
    dVar1 = in_RSI[lVar5];
    dVar8 = -dVar1;
    if (-dVar1 <= dVar1) {
      dVar8 = dVar1;
    }
    this->v[lVar5] = dVar1 / dVar9;
    if (dVar2 < dVar8) break;
    lVar5 = 1;
    bVar3 = !bVar6;
    bVar6 = false;
    if (bVar3) goto LAB_0010867d;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"! taking the norm of a zero",0x1b);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," vector",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  do {
    dVar2 = in_RSI[lVar5] / dVar9;
    this->v[lVar5] = dVar2;
    bVar6 = lVar5 == 0;
    lVar5 = 1;
    dVar7 = dVar9;
  } while (bVar6);
LAB_0010867d:
  VVar10.v[1] = dVar7;
  VVar10.v[0] = dVar2;
  return (Vector<double,_2>)VVar10.v;
}

Assistant:

Vector<T,D> Vector<T,D>::normalize() const     // normalize
    {
        Vector<T,D> newv;
        T magnitude = norm();
        int i;
        for(i=0; i<D; i++){
            newv.v[i] = v[i] / magnitude;
            if(ABS(v[i]) > magnitude * HUGENUMBER){
                cerr << "! taking the norm of a zero" << D << " vector" << endl;
                break;
            }
        }
        for(; i < D; i++){
            newv.v[i] = v[i] / magnitude;
        }
        return newv;
    }